

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O0

void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *ctx,int state)

{
  statemachine_definition *psVar1;
  statemachine_definition *def;
  int state_local;
  statemachine_ctx *ctx_local;
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0xb6,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)"
                 );
  }
  if (ctx->definition == (statemachine_definition *)0x0) {
    __assert_fail("ctx->definition != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0xb7,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)"
                 );
  }
  psVar1 = ctx->definition;
  if (psVar1->num_states <= state) {
    __assert_fail("state < def->num_states",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                  ,0xbb,"void ctemplate_htmlparser::statemachine_set_state(statemachine_ctx *, int)"
                 );
  }
  ctx->next_state = state;
  if (ctx->current_state != ctx->next_state) {
    if (psVar1->exit_state_events[ctx->current_state] != (state_event_function)0x0) {
      (*psVar1->exit_state_events[ctx->current_state])(ctx,ctx->current_state,'\0',ctx->next_state);
    }
    if (psVar1->enter_state_events[ctx->next_state] != (state_event_function)0x0) {
      (*psVar1->enter_state_events[ctx->next_state])(ctx,ctx->current_state,'\0',ctx->next_state);
    }
  }
  ctx->current_state = state;
  return;
}

Assistant:

void statemachine_set_state(statemachine_ctx *ctx, int state)
{

  statemachine_definition *def;

  assert(ctx != NULL);
  assert(ctx->definition != NULL);

  def = ctx->definition;

  assert(state < def->num_states);

  ctx->next_state = state;

  if (ctx->current_state != ctx->next_state) {
    if (def->exit_state_events[ctx->current_state])
       def->exit_state_events[ctx->current_state](ctx,
                                                 ctx->current_state,
                                                 '\0',
                                                 ctx->next_state);

    if (def->enter_state_events[ctx->next_state])
       def->enter_state_events[ctx->next_state](ctx,
                                               ctx->current_state,
                                               '\0',
                                               ctx->next_state);
  }

  ctx->current_state = state;
}